

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutRec * ClipperLib::GetLowermostRec(OutRec *outRec1,OutRec *outRec2)

{
  OutPt *btmPt2;
  bool bVar1;
  OutPt *pOVar2;
  OutPt *OutPt2;
  OutPt *OutPt1;
  OutRec *outRec2_local;
  OutRec *outRec1_local;
  
  if (outRec1->BottomPt == (OutPt *)0x0) {
    pOVar2 = GetBottomPt(outRec1->Pts);
    outRec1->BottomPt = pOVar2;
  }
  if (outRec2->BottomPt == (OutPt *)0x0) {
    pOVar2 = GetBottomPt(outRec2->Pts);
    outRec2->BottomPt = pOVar2;
  }
  pOVar2 = outRec1->BottomPt;
  btmPt2 = outRec2->BottomPt;
  outRec1_local = outRec1;
  if (((((pOVar2->Pt).Y <= (btmPt2->Pt).Y) &&
       (outRec1_local = outRec2, (btmPt2->Pt).Y <= (pOVar2->Pt).Y)) &&
      (outRec1_local = outRec1, (btmPt2->Pt).X <= (pOVar2->Pt).X)) &&
     (((outRec1_local = outRec2, (pOVar2->Pt).X <= (btmPt2->Pt).X && (pOVar2->Next != pOVar2)) &&
      ((outRec1_local = outRec1, btmPt2->Next != btmPt2 &&
       (bVar1 = FirstIsBottomPt(pOVar2,btmPt2), !bVar1)))))) {
    outRec1_local = outRec2;
  }
  return outRec1_local;
}

Assistant:

OutRec* GetLowermostRec(OutRec *outRec1, OutRec *outRec2)
{
  //work out which polygon fragment has the correct hole state ...
  if (!outRec1->BottomPt) 
    outRec1->BottomPt = GetBottomPt(outRec1->Pts);
  if (!outRec2->BottomPt) 
    outRec2->BottomPt = GetBottomPt(outRec2->Pts);
  OutPt *OutPt1 = outRec1->BottomPt;
  OutPt *OutPt2 = outRec2->BottomPt;
  if (OutPt1->Pt.Y > OutPt2->Pt.Y) return outRec1;
  else if (OutPt1->Pt.Y < OutPt2->Pt.Y) return outRec2;
  else if (OutPt1->Pt.X < OutPt2->Pt.X) return outRec1;
  else if (OutPt1->Pt.X > OutPt2->Pt.X) return outRec2;
  else if (OutPt1->Next == OutPt1) return outRec2;
  else if (OutPt2->Next == OutPt2) return outRec1;
  else if (FirstIsBottomPt(OutPt1, OutPt2)) return outRec1;
  else return outRec2;
}